

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O2

void stable_rec_stable_sort(int **arr,size_t L)

{
  int *piVar1;
  int L1;
  uint uVar2;
  int m;
  ulong uVar3;
  int *c;
  long lVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  int **A;
  
  for (uVar3 = 1; uVar3 < L; uVar3 = uVar3 + 2) {
    piVar1 = arr[uVar3 - 1];
    if (*arr[uVar3] < *piVar1) {
      arr[uVar3 - 1] = arr[uVar3];
      arr[uVar3] = piVar1;
    }
  }
  uVar3 = 2;
  while (uVar3 < L) {
    L1 = (int)uVar3;
    uVar2 = L1 * 2;
    uVar6 = L & 0xffffffff;
    lVar7 = 0;
    lVar4 = 0;
    A = arr;
    while( true ) {
      iVar5 = (int)uVar6;
      if ((int)L + L1 * -2 < lVar4) break;
      stable_grail_rec_merge(A,L1,L1);
      lVar4 = lVar4 + (int)uVar2;
      lVar7 = lVar7 + (uVar3 << 0x21);
      uVar6 = (ulong)(uint)(iVar5 + L1 * -2);
      A = A + (int)uVar2;
    }
    uVar3 = (ulong)uVar2;
    if (iVar5 - L1 != 0 && L1 <= iVar5) {
      stable_grail_rec_merge((int **)((lVar7 >> 0x1d) + (long)arr),L1,iVar5 - L1);
    }
  }
  return;
}

Assistant:

void REC_STABLE_SORT(SORT_TYPE *arr, size_t L) {
  int m, h, p0, p1, rest;

  for (m = 1; m < L; m += 2) {
    if (SORT_CMP_A(arr + m - 1, arr + m) > 0) {
      GRAIL_SWAP1(arr + (m - 1), arr + m);
    }
  }

  for (h = 2; h < L; h *= 2) {
    p0 = 0;
    p1 = (int)(L - 2 * h);

    while (p0 <= p1) {
      GRAIL_REC_MERGE(arr + p0, h, h);
      p0 += 2 * h;
    }

    rest = (int)(L - p0);

    if (rest > h) {
      GRAIL_REC_MERGE(arr + p0, h, rest - h);
    }
  }
}